

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_writer.c
# Opt level: O0

void write_header(FILE *file,AvxVideoInfo *info,int frame_count)

{
  long in_RSI;
  aom_codec_enc_cfg cfg;
  uint in_stack_fffffffffffffc74;
  aom_codec_enc_cfg *in_stack_fffffffffffffc78;
  FILE *in_stack_fffffffffffffc80;
  
  ivf_write_file_header
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
             *(int *)(in_RSI + 8));
  return;
}

Assistant:

static void write_header(FILE *file, const AvxVideoInfo *info,
                         int frame_count) {
  struct aom_codec_enc_cfg cfg;
  cfg.g_w = info->frame_width;
  cfg.g_h = info->frame_height;
  cfg.g_timebase.num = info->time_base.numerator;
  cfg.g_timebase.den = info->time_base.denominator;

  ivf_write_file_header(file, &cfg, info->codec_fourcc, frame_count);
}